

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O2

int Abc_NtkMfsResubNode(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  
  lVar5 = 0;
  while( true ) {
    uVar3 = (ulong)(pNode->vFanins).nSize;
    if ((long)uVar3 <= lVar5) {
      if (p->pPars->fArea == 0) {
        for (lVar5 = 0; lVar5 < (int)uVar3; lVar5 = lVar5 + 1) {
          pvVar1 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]];
          uVar4 = *(uint *)((long)pvVar1 + 0x14) & 0xf;
          if (((uVar4 == 2) || (uVar4 == 5)) || (*(int *)((long)pvVar1 + 0x2c) != 1)) {
            iVar2 = Abc_NtkMfsSolveSatResub(p,pNode,(int)lVar5,1,0);
            if (iVar2 != 0) {
              return 1;
            }
            uVar3 = (ulong)(uint)(pNode->vFanins).nSize;
          }
        }
      }
      return 0;
    }
    pvVar1 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]];
    uVar4 = *(uint *)((long)pvVar1 + 0x14) & 0xf;
    if ((((uVar4 != 2) && (uVar4 != 5)) && (*(int *)((long)pvVar1 + 0x2c) == 1)) &&
       (iVar2 = Abc_NtkMfsSolveSatResub(p,pNode,(int)lVar5,0,0), iVar2 != 0)) break;
    lVar5 = lVar5 + 1;
  }
  return 1;
}

Assistant:

int Abc_NtkMfsResubNode( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    int i;
    // try replacing area critical fanins
    Abc_ObjForEachFanin( pNode, pFanin, i )
        if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
                return 1;
        }
    // try removing redundant edges
    if ( !p->pPars->fArea )
    {
        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( Abc_ObjIsCi(pFanin) || Abc_ObjFanoutNum(pFanin) != 1 )
            {
                if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 1, 0 ) )
                    return 1;
            }
    }
    if ( Abc_ObjFaninNum(pNode) == p->nFaninMax )
        return 0;
/*
    // try replacing area critical fanins while adding two new fanins
    Abc_ObjForEachFanin( pNode, pFanin, i )
        if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
        {
            if ( Abc_NtkMfsSolveSatResub2( p, pNode, i, -1 ) )
                return 1;
        }
*/
    return 0;
}